

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::TryOptimizeCallInstrWithFixedMethod
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlineeInfo,bool isPolymorphic,
          bool isBuiltIn,bool isCtor,bool isInlined,bool *safeThis,bool dontOptimizeJustCheck,uint i
          )

{
  InlineCacheIndex IVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  ValueType valueType;
  uint uVar4;
  uint uVar5;
  PropertyId PVar6;
  JITManager *this_01;
  JITTimeFunctionBody *pJVar7;
  char16 *pcVar8;
  char16 *pcVar9;
  undefined4 *puVar10;
  Opnd *pOVar11;
  RegOpnd *pRVar12;
  StackSym *pSVar13;
  char16_t *pcVar14;
  PropertySymOpnd *this_02;
  ThreadContext *pTVar15;
  PropertyRecord *pPVar16;
  char16 *pcVar17;
  char16_t *pcVar18;
  intptr_t iVar19;
  intptr_t iVar20;
  Instr *this_03;
  BailOutInfo *pBVar21;
  Opnd *pOVar22;
  SymOpnd *this_04;
  PropertySymOpnd *this_05;
  ProfiledInstr *pPVar23;
  AddrOpnd *src1Opnd;
  Instr *instr;
  BailOutKind kind;
  char16_t *pcVar24;
  char16_t *pcVar25;
  undefined8 in_stack_fffffffffffffae8;
  undefined4 uVar26;
  undefined8 in_stack_fffffffffffffaf8;
  undefined4 uVar27;
  TypeId local_4e4;
  char16_t *local_4b0;
  char16_t *local_458;
  char16_t *local_440;
  char16_t *local_410;
  JITTimeFunctionBody *local_408;
  JITTimeFunctionBody *local_400;
  JITTimeFunctionBody *local_3f8;
  char16_t *local_3f0;
  char16_t *local_3c0;
  JITTimeFunctionBody *local_3b8;
  char16_t *local_3b0;
  char16_t *local_380;
  JITTimeFunctionBody *local_378;
  char16_t *local_358;
  char16_t *local_330;
  JITTimeFunctionBody *local_328;
  char16_t *local_320;
  char16_t *local_2f8;
  JITTimeFunctionBody *local_2f0;
  char16_t *local_2e8;
  char16_t *local_2c0;
  JITTimeFunctionBody *local_2b8;
  intptr_t local_2b0;
  char16_t *local_290;
  char16_t *local_270;
  JITTimeFunctionBody *local_268;
  byte local_255;
  TypeId typeId;
  StackSym *methodSym;
  Instr *ldMethodValueInstr;
  AddrOpnd *constMethodValueOpnd;
  JITTimeConstructorCache *constructorCache;
  PropertySymOpnd *chkMethodFldOpnd;
  Instr *chkMethodFldInstr;
  Opnd *methodValueDstOpnd;
  PropertyRecord *methodPropertyRecord_3;
  PropertyId methodPropertyId_3;
  char16 *calleeName_7;
  JITTimeFunctionBody *calleeFunctionBody_7;
  PropertyRecord *methodPropertyRecord_2;
  PropertyId methodPropertyId_2;
  char16 *calleeName_6;
  JITTimeFunctionBody *calleeFunctionBody_6;
  FixedFieldInfo *fixedField;
  PropertyRecord *methodPropertyRecord_1;
  PropertyId methodPropertyId_1;
  char16 *calleeName_5;
  JITTimeFunctionBody *calleeFunctionBody_5;
  PropertyRecord *methodPropertyRecord;
  PropertyId methodPropertyId;
  char16 *calleeName_4;
  JITTimeFunctionBody *calleeFunctionBody_4;
  PropertySymOpnd *methodPropertyOpnd;
  char16 *calleeName_3;
  JITTimeFunctionBody *calleeFunctionBody_3;
  char16 *calleeName_2;
  JITTimeFunctionBody *calleeFunctionBody_2;
  StackSym *sym;
  Instr *ldMethodFldInstr;
  char16 *calleeName_1;
  JITTimeFunctionBody *calleeFunctionBody_1;
  StackSym *methodValueSym;
  char16 *calleeName;
  JITTimeFunctionBody *calleeFunctionBody;
  wchar local_108 [3];
  bool printFixedFieldsTrace;
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  bool dontOptimizeJustCheck_local;
  bool isInlined_local;
  bool isCtor_local;
  bool isBuiltIn_local;
  bool isPolymorphic_local;
  FunctionJITTimeInfo *inlineeInfo_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffffaf8 >> 0x20);
  uVar26 = (undefined4)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  uVar4 = Func::GetSourceContextId(callInstr->m_func);
  uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedMethodsPhase,uVar4,uVar5);
  if (bVar3) {
    return false;
  }
  uVar4 = Func::GetSourceContextId(callInstr->m_func);
  uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FixedMethodsPhase,uVar4,uVar5);
  if (bVar3) {
LAB_0071182a:
    local_255 = 0;
    if (!dontOptimizeJustCheck) {
      this_01 = JITManager::GetJITManager();
      bVar3 = JITManager::IsJITServer(this_01);
      local_255 = bVar3 ^ 0xff;
    }
  }
  else {
    uVar4 = Func::GetSourceContextId(callInstr->m_func);
    uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixedMethodsPhase,uVar4,uVar5);
    if (bVar3) goto LAB_0071182a;
    local_255 = 0;
    if (isCtor) {
      uVar4 = Func::GetSourceContextId(callInstr->m_func);
      uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FixedNewObjPhase,uVar4,uVar5);
      if (!bVar3) {
        uVar4 = Func::GetSourceContextId(callInstr->m_func);
        uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixedNewObjPhase,uVar4,uVar5);
        local_255 = 0;
        if (!bVar3) goto LAB_0071184d;
      }
      goto LAB_0071182a;
    }
  }
LAB_0071184d:
  local_255 = local_255 & 1;
  if (local_255 != 0) {
    if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
       (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
      local_268 = (JITTimeFunctionBody *)0x0;
    }
    else {
      local_268 = FunctionJITTimeInfo::GetBody(inlineeInfo);
    }
    if (local_268 == (JITTimeFunctionBody *)0x0) {
      local_270 = L"<unknown>";
    }
    else {
      local_270 = JITTimeFunctionBody::GetDisplayName(local_268);
    }
    pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
    pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
    pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
    if (local_268 == (JITTimeFunctionBody *)0x0) {
      local_290 = L"(null)";
    }
    else {
      local_290 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
    }
    if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
      local_2b0 = 0;
    }
    else {
      local_2b0 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
    }
    Output::Print(L"FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"
                  ,pcVar8,pcVar9,local_270,local_290,(ulong)isPolymorphic,
                  CONCAT44(uVar26,(uint)isBuiltIn),(uint)isCtor,CONCAT44(uVar27,(uint)isInlined),
                  local_2b0);
    Output::Flush();
  }
  if (((isPolymorphic) && (isInlined)) && (!dontOptimizeJustCheck)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x633,"(dontOptimizeJustCheck)","dontOptimizeJustCheck");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pOVar11 = IR::Instr::GetSrc1(callInstr);
  pRVar12 = IR::Opnd::AsRegOpnd(pOVar11);
  pSVar13 = Sym::AsStackSym(&pRVar12->m_sym->super_Sym);
  bVar3 = StackSym::IsSingleDef(pSVar13);
  if (!bVar3) {
    if (local_255 != 0) {
      if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
         (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
        local_2b8 = (JITTimeFunctionBody *)0x0;
      }
      else {
        local_2b8 = FunctionJITTimeInfo::GetBody(inlineeInfo);
      }
      if (local_2b8 == (JITTimeFunctionBody *)0x0) {
        local_2c0 = L"<unknown>";
      }
      else {
        local_2c0 = JITTimeFunctionBody::GetDisplayName(local_2b8);
      }
      pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
      pcVar14 = L"calling";
      if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
        pcVar14 = L"inlining";
      }
      if (local_2b8 == (JITTimeFunctionBody *)0x0) {
        local_2e8 = L"(null)";
      }
      else {
        local_2e8 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
      }
      Output::Print(L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"
                    ,pcVar8,pcVar9,pcVar14,local_2c0,local_2e8);
      Output::Flush();
    }
    return false;
  }
  sym = (StackSym *)StackSym::GetInstrDef(pSVar13);
  while (*(short *)&sym->m_tempNumberSym == 0x242) {
    pOVar11 = IR::Instr::GetSrc1((Instr *)sym);
    pSVar13 = IR::Opnd::GetStackSym(pOVar11);
    bVar3 = StackSym::IsSingleDef(pSVar13);
    if (!bVar3) {
      if (local_255 != 0) {
        if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
           (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
          local_2f0 = (JITTimeFunctionBody *)0x0;
        }
        else {
          local_2f0 = FunctionJITTimeInfo::GetBody(inlineeInfo);
        }
        if (local_2f0 == (JITTimeFunctionBody *)0x0) {
          local_2f8 = L"<unknown>";
        }
        else {
          local_2f8 = JITTimeFunctionBody::GetDisplayName(local_2f0);
        }
        pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
        pcVar14 = L"calling";
        if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
          pcVar14 = L"inlining";
        }
        if (local_2f0 == (JITTimeFunctionBody *)0x0) {
          local_320 = L"(null)";
        }
        else {
          local_320 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
        }
        Output::Print(L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"
                      ,pcVar8,pcVar9,pcVar14,local_2f8,local_320);
        Output::Flush();
      }
      return false;
    }
    sym = (StackSym *)StackSym::GetInstrDef(pSVar13);
  }
  if (((((*(short *)&sym->m_tempNumberSym != 0x85) && (*(short *)&sym->m_tempNumberSym != 0x6e)) &&
       (*(short *)&sym->m_tempNumberSym != 0x6c)) &&
      ((*(short *)&sym->m_tempNumberSym != 0x6a && (*(short *)&sym->m_tempNumberSym != 0x5e)))) &&
     ((*(short *)&sym->m_tempNumberSym != 0x68 && (*(short *)&sym->m_tempNumberSym != 0x1f5)))) {
    if (local_255 != 0) {
      if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
         (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
        local_328 = (JITTimeFunctionBody *)0x0;
      }
      else {
        local_328 = FunctionJITTimeInfo::GetBody(inlineeInfo);
      }
      if (local_328 == (JITTimeFunctionBody *)0x0) {
        local_330 = L"<unknown>";
      }
      else {
        local_330 = JITTimeFunctionBody::GetDisplayName(local_328);
      }
      pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
      pcVar14 = L"calling";
      if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
        pcVar14 = L"inlining";
      }
      if (local_328 == (JITTimeFunctionBody *)0x0) {
        local_358 = L"(null)";
      }
      else {
        local_358 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
      }
      Output::Print(L"FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"
                    ,pcVar8,pcVar9,pcVar14,local_330,local_358);
      Output::Flush();
    }
    return false;
  }
  pOVar11 = IR::Instr::GetSrc1((Instr *)sym);
  this_02 = IR::Opnd::AsPropertySymOpnd(pOVar11);
  if (isCtor) {
    if (isInlined) {
      uVar4 = Func::GetSourceContextId(callInstr->m_func);
      uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedCtorInliningPhase,uVar4,uVar5);
      if (!bVar3) goto LAB_0071206c;
    }
    else {
LAB_0071206c:
      if (!isInlined) {
        uVar4 = Func::GetSourceContextId(callInstr->m_func);
        uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FixedCtorCallsPhase,uVar4,uVar5);
        if (bVar3) goto LAB_00712224;
      }
      bVar3 = IR::PropertySymOpnd::UsesAccessor(this_02);
      if (!bVar3) goto LAB_007120ce;
    }
LAB_00712224:
    if (local_255 != 0) {
      if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
         (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
        local_378 = (JITTimeFunctionBody *)0x0;
      }
      else {
        local_378 = FunctionJITTimeInfo::GetBody(inlineeInfo);
      }
      if (local_378 == (JITTimeFunctionBody *)0x0) {
        local_380 = L"<unknown>";
      }
      else {
        local_380 = JITTimeFunctionBody::GetDisplayName(local_378);
      }
      pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
      PVar6 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar7,this_02->m_inlineCacheIndex);
      pTVar15 = Func::GetInProcThreadContext(callInstr->m_func);
      pPVar16 = ThreadContext::GetPropertyRecord(pTVar15,PVar6);
      pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
      pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
      pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
      pcVar14 = L"calling";
      if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
        pcVar14 = L"inlining";
      }
      pcVar17 = Js::PropertyRecord::GetBuffer(pPVar16);
      if (local_378 == (JITTimeFunctionBody *)0x0) {
        local_3b0 = L"(null)";
      }
      else {
        local_3b0 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
      }
      pcVar25 = L"calling";
      if (isInlined) {
        pcVar25 = L"inlining";
      }
      pcVar24 = L"script";
      if (isBuiltIn) {
        pcVar24 = L"built-in";
      }
      pcVar18 = L"methods";
      if (isCtor) {
        pcVar18 = L"ctors";
      }
      Output::Print(L"FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"
                    ,pcVar8,pcVar9,pcVar14,pcVar17,local_380,local_3b0,this_02->m_inlineCacheIndex,
                    pcVar25,pcVar24,pcVar18);
      Output::Flush();
    }
    this_local._7_1_ = false;
  }
  else {
LAB_007120ce:
    if (!isCtor) {
      if (isBuiltIn) {
        if (isInlined) {
          uVar4 = Func::GetSourceContextId(callInstr->m_func);
          uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01eafdf0,FixedBuiltInMethodInliningPhase,uVar4,uVar5);
          if (bVar3) goto LAB_00712224;
        }
        if (!isInlined) {
          uVar4 = Func::GetSourceContextId(callInstr->m_func);
          uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01eafdf0,FixedBuiltInMethodCallsPhase,uVar4,uVar5);
          if (bVar3) goto LAB_00712224;
        }
      }
      if (!isBuiltIn) {
        if (isInlined) {
          uVar4 = Func::GetSourceContextId(callInstr->m_func);
          uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01eafdf0,FixedScriptMethodInliningPhase,uVar4,uVar5);
          if (bVar3) goto LAB_00712224;
        }
        if (!isInlined) {
          uVar4 = Func::GetSourceContextId(callInstr->m_func);
          uVar5 = Func::GetLocalFunctionId(callInstr->m_func);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01eb5b30,FixedScriptMethodCallsPhase,uVar4,uVar5);
          if (!bVar3) goto LAB_00712224;
        }
      }
    }
    bVar3 = IR::PropertySymOpnd::IsObjTypeSpecCandidate(this_02);
    if ((bVar3) ||
       (bVar3 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_02), bVar3)) {
      calleeFunctionBody_6 = (JITTimeFunctionBody *)0x0;
      if (isPolymorphic) {
        if ((isPolymorphic) && (isInlined)) {
          bVar3 = IR::PropertySymOpnd::HasFixedValue(this_02);
          if (bVar3) {
            local_400 = (JITTimeFunctionBody *)IR::PropertySymOpnd::GetFixedFunction(this_02,i);
          }
          else {
            local_400 = (JITTimeFunctionBody *)0x0;
          }
          calleeFunctionBody_6 = local_400;
        }
      }
      else {
        bVar3 = IR::PropertySymOpnd::HasFixedValue(this_02);
        if (bVar3) {
          local_3f8 = (JITTimeFunctionBody *)IR::PropertySymOpnd::GetFixedFunction(this_02);
        }
        else {
          local_3f8 = (JITTimeFunctionBody *)0x0;
        }
        calleeFunctionBody_6 = local_3f8;
      }
      if (calleeFunctionBody_6 == (JITTimeFunctionBody *)0x0) {
        if (local_255 != 0) {
          if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
             (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
            local_408 = (JITTimeFunctionBody *)0x0;
          }
          else {
            local_408 = FunctionJITTimeInfo::GetBody(inlineeInfo);
          }
          if (local_408 == (JITTimeFunctionBody *)0x0) {
            local_410 = L"<unknown>";
          }
          else {
            local_410 = JITTimeFunctionBody::GetDisplayName(local_408);
          }
          pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
          PVar6 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar7,this_02->m_inlineCacheIndex);
          pTVar15 = Func::GetInProcThreadContext(callInstr->m_func);
          pPVar16 = ThreadContext::GetPropertyRecord(pTVar15,PVar6);
          pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
          pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
          pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
          pcVar14 = L"calling";
          if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
            pcVar14 = L"inlining";
          }
          pcVar17 = Js::PropertyRecord::GetBuffer(pPVar16);
          if (local_408 == (JITTimeFunctionBody *)0x0) {
            local_440 = L"(null)";
          }
          else {
            local_440 = FunctionJITTimeInfo::GetDebugNumberSet
                                  (inlineeInfo,(wchar (*) [42])local_108);
          }
          IVar1 = this_02->m_inlineCacheIndex;
          bVar3 = IR::PropertySymOpnd::IsLoadedFromProto(this_02);
          if (bVar3) {
            local_458 = L"proto";
          }
          else {
            bVar3 = IR::PropertySymOpnd::UsesAccessor(this_02);
            local_458 = L"local";
            if (bVar3) {
              local_458 = L"accessor";
            }
          }
          Output::Print(L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"
                        ,pcVar8,pcVar9,pcVar14,pcVar17,local_410,local_440,IVar1,local_458);
          Output::Flush();
        }
        this_local._7_1_ = false;
      }
      else {
        if (inlineeInfo == (FunctionJITTimeInfo *)0x0) {
          pOVar11 = IR::Instr::GetSrc1(callInstr);
          bVar3 = Func::IsBuiltInInlinedInLowerer(pOVar11);
          if (bVar3) {
            if (local_255 != 0) {
              pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
              PVar6 = JITTimeFunctionBody::GetPropertyIdFromCacheId
                                (pJVar7,this_02->m_inlineCacheIndex);
              pTVar15 = Func::GetInProcThreadContext(callInstr->m_func);
              pPVar16 = ThreadContext::GetPropertyRecord(pTVar15,PVar6);
              pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
              pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
              pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
              pcVar17 = Js::PropertyRecord::GetBuffer(pPVar16);
              IVar1 = this_02->m_inlineCacheIndex;
              bVar3 = IR::PropertySymOpnd::IsLoadedFromProto(this_02);
              if (bVar3) {
                local_4b0 = L"proto";
              }
              else {
                bVar3 = IR::PropertySymOpnd::UsesAccessor(this_02);
                local_4b0 = L"local";
                if (bVar3) {
                  local_4b0 = L"accessor";
                }
              }
              Output::Print(L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"
                            ,pcVar8,pcVar9,L"calling",pcVar17,L"<unknown>",L"(null)",IVar1,local_4b0
                           );
              Output::Flush();
            }
            return false;
          }
        }
        if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
          iVar19 = FixedFieldInfo::GetFuncInfoAddr((FixedFieldInfo *)calleeFunctionBody_6);
          iVar20 = FunctionJITTimeInfo::GetFunctionInfoAddr(inlineeInfo);
          if (iVar19 != iVar20) {
            return false;
          }
        }
        if (dontOptimizeJustCheck) {
          this_local._7_1_ = true;
        }
        else {
          if (*(short *)&sym->m_tempNumberSym == 0x1f5) {
            bVar3 = IR::Instr::HasBailOutInfo((Instr *)sym);
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x736,"(ldMethodFldInstr->HasBailOutInfo())",
                                 "ldMethodFldInstr->HasBailOutInfo()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            IR::Instr::ClearBailOutInfo((Instr *)sym);
          }
          *(undefined2 *)&sym->m_tempNumberSym = 0x270;
          pOVar11 = IR::Instr::UnlinkDst((Instr *)sym);
          bVar3 = IR::PropertySymOpnd::HasEquivalentTypeSet(this_02);
          kind = BailOutFailedEquivalentFixedFieldTypeCheck;
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            kind = BailOutFailedFixedFieldTypeCheck;
          }
          this_03 = IR::Instr::ConvertToBailOutInstr((Instr *)sym,(Instr *)sym,kind,0xffffffff);
          IVar1 = this_02->m_inlineCacheIndex;
          pBVar21 = IR::Instr::GetBailOutInfo(this_03);
          pBVar21->polymorphicCacheIndex = IVar1;
          pOVar22 = IR::Instr::GetSrc1(this_03);
          bVar3 = IR::Opnd::IsSymOpnd(pOVar22);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x73f,"(chkMethodFldInstr->GetSrc1()->IsSymOpnd())",
                               "chkMethodFldInstr->GetSrc1()->IsSymOpnd()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          pOVar22 = IR::Instr::GetSrc1(this_03);
          this_04 = IR::Opnd::AsSymOpnd(pOVar22);
          bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_04);
          if (bVar3) {
            if (this_03->m_opcode != CheckFixedFld) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x742,"(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld)"
                                 ,"chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            pOVar22 = IR::Instr::GetSrc1(this_03);
            this_05 = IR::Opnd::AsPropertySymOpnd(pOVar22);
            bVar3 = IR::PropertySymOpnd::IsMono(this_05);
            if (((!bVar3) && (bVar3 = IR::PropertySymOpnd::IsLoadedFromProto(this_05), !bVar3)) &&
               (bVar3 = IR::PropertySymOpnd::UsesAccessor(this_05), !bVar3)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x745,
                                 "(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor())"
                                 ,
                                 "chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor()"
                                );
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            IR::PropertySymOpnd::SetUsesFixedValue(this_05,true);
          }
          if (((isCtor) &&
              (constMethodValueOpnd = (AddrOpnd *)IR::PropertySymOpnd::GetCtorCache(this_02),
              constMethodValueOpnd != (AddrOpnd *)0x0)) &&
             ((bVar3 = IR::Instr::IsProfiledInstr(callInstr), bVar3 &&
              (callInstr->m_opcode != NewScObjArray)))) {
            bVar3 = JITTimeConstructorCache::IsUsed((JITTimeConstructorCache *)constMethodValueOpnd)
            ;
            if (bVar3) {
              constMethodValueOpnd =
                   (AddrOpnd *)
                   JITTimeConstructorCache::Clone
                             ((JITTimeConstructorCache *)constMethodValueOpnd,this->topFunc->m_alloc
                             );
            }
            bVar3 = JITTimeConstructorCache::IsUsed((JITTimeConstructorCache *)constMethodValueOpnd)
            ;
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0x76e,"(!constructorCache->IsUsed())",
                                 "!constructorCache->IsUsed()");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar10 = 0;
            }
            JITTimeConstructorCache::SetUsed((JITTimeConstructorCache *)constMethodValueOpnd,true);
            this_00 = callInstr->m_func;
            pPVar23 = IR::Instr::AsProfiledInstr(callInstr);
            Func::SetConstructorCache
                      (this_00,(pPVar23->u).field_3.fldInfoData.f1,
                       (JITTimeConstructorCache *)constMethodValueOpnd);
          }
          iVar19 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)calleeFunctionBody_6);
          src1Opnd = IR::AddrOpnd::New(iVar19,AddrOpndKindDynamicVar,callInstr->m_func,false,
                                       (Var)0x0);
          src1Opnd->m_metadata = calleeFunctionBody_6;
          src1Opnd->field_0x28 = src1Opnd->field_0x28 & 0xfd | 2;
          instr = IR::Instr::New(Ld_A,pOVar11,&src1Opnd->super_Opnd,callInstr->m_func);
          pRVar12 = IR::Opnd::AsRegOpnd(pOVar11);
          pSVar13 = pRVar12->m_sym;
          bVar3 = StackSym::IsSingleDef(pSVar13);
          if (bVar3) {
            StackSym::SetIsConst(pSVar13);
          }
          valueType = FixedFieldInfo::GetValueType((FixedFieldInfo *)calleeFunctionBody_6);
          IR::Opnd::SetValueType(pOVar11,valueType);
          IR::Instr::InsertAfter(this_03,instr);
          IR::Instr::ReplaceSrc1(callInstr,&src1Opnd->super_Opnd);
          if ((callInstr->m_opcode == CallI) ||
             (bVar3 = IR::Instr::CallsAccessor(callInstr,this_02), bVar3)) {
            callInstr->m_opcode = CallIFixed;
          }
          else if ((callInstr->m_opcode != NewScObject) && (callInstr->m_opcode != NewScObjArray)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                               ,0x7a0,
                               "(callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray)"
                               ,
                               "callInstr->m_opcode == Js::OpCode::NewScObject || callInstr->m_opcode == Js::OpCode::NewScObjArray"
                              );
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          if ((!isBuiltIn) && (isInlined)) {
            bVar3 = IR::PropertySymOpnd::IsRootObjectNonConfigurableField(this_02);
            if (bVar3) {
              local_4e4 = TypeIds_GlobalObject;
            }
            else {
              local_4e4 = IR::PropertySymOpnd::GetTypeId(this_02);
            }
            if ((0x16 < (int)local_4e4) && ((int)local_4e4 < 0x52)) {
              *safeThis = true;
            }
          }
          this_local._7_1_ = true;
        }
      }
    }
    else {
      if (local_255 != 0) {
        if ((inlineeInfo == (FunctionJITTimeInfo *)0x0) ||
           (bVar3 = FunctionJITTimeInfo::HasBody(inlineeInfo), !bVar3)) {
          local_3b8 = (JITTimeFunctionBody *)0x0;
        }
        else {
          local_3b8 = FunctionJITTimeInfo::GetBody(inlineeInfo);
        }
        if (local_3b8 == (JITTimeFunctionBody *)0x0) {
          local_3c0 = L"<unknown>";
        }
        else {
          local_3c0 = JITTimeFunctionBody::GetDisplayName(local_3b8);
        }
        pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
        PVar6 = JITTimeFunctionBody::GetPropertyIdFromCacheId(pJVar7,this_02->m_inlineCacheIndex);
        pTVar15 = Func::GetInProcThreadContext(callInstr->m_func);
        pPVar16 = ThreadContext::GetPropertyRecord(pTVar15,PVar6);
        pJVar7 = Func::GetJITFunctionBody(callInstr->m_func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar7);
        pcVar9 = Func::GetDebugNumberSet(callInstr->m_func,(wchar (*) [42])local_a8);
        pcVar14 = L"calling";
        if (inlineeInfo != (FunctionJITTimeInfo *)0x0) {
          pcVar14 = L"inlining";
        }
        pcVar17 = Js::PropertyRecord::GetBuffer(pPVar16);
        if (local_3b8 == (JITTimeFunctionBody *)0x0) {
          local_3f0 = L"(null)";
        }
        else {
          local_3f0 = FunctionJITTimeInfo::GetDebugNumberSet(inlineeInfo,(wchar (*) [42])local_108);
        }
        Output::Print(L"FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"
                      ,pcVar8,pcVar9,pcVar14,pcVar17,local_3c0,local_3f0,this_02->m_inlineCacheIndex
                     );
        Output::Flush();
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::TryOptimizeCallInstrWithFixedMethod(IR::Instr *callInstr, const FunctionJITTimeInfo * inlineeInfo, bool isPolymorphic, bool isBuiltIn, bool isCtor, bool isInlined, bool &safeThis,
                                            bool dontOptimizeJustCheck, uint i /*i-th inlinee at a polymorphic call site*/)
{
    if (PHASE_OFF(Js::FixedMethodsPhase, callInstr->m_func))
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
#define TRACE_FIXED_FIELDS 1
#endif

#if TRACE_FIXED_FIELDS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    bool printFixedFieldsTrace =
        (
            PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func) ||
            (isCtor && (
                PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) ||
                PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func)))
        ) && !dontOptimizeJustCheck && !JITManager::GetJITManager()->IsJITServer();

    if (printFixedFieldsTrace)
    {
        JITTimeFunctionBody * calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
        const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

        Output::Print(_u("FixedFields: function %s (%s): considering method (%s %s): polymorphic = %d, built-in = %d, ctor = %d, inlined = %d, functionInfo = %p.\n"),
            callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), calleeName,
            calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
            isPolymorphic, isBuiltIn, isCtor, isInlined, inlineeInfo ? inlineeInfo->GetFunctionInfoAddr() : 0);
        Output::Flush();
    }
#endif

    if (isPolymorphic && isInlined)
    {
        Assert(dontOptimizeJustCheck);
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    while (ldMethodFldInstr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
    {
        StackSym* sym = ldMethodFldInstr->GetSrc1()->GetStackSym();
        if (!sym->IsSingleDef())
        {
#if TRACE_FIXED_FIELDS
            if (printFixedFieldsTrace)
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

                Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee is not single def.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                    calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
                Output::Flush();
            }
#endif
            return false;
        }
        ldMethodFldInstr = sym->GetInstrDef();
    }
    if (ldMethodFldInstr->m_opcode != Js::OpCode::ScopedLdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdRootFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFld
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdFldForCallApplyTarget
        && ldMethodFldInstr->m_opcode != Js::OpCode::LdMethodFromFlags)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method (%s %s), because callee does not come from LdMethodFld.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"));
            Output::Flush();
        }
#endif
        return false;
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();

    if ((isCtor &&
            ((isInlined && PHASE_OFF(Js::FixedCtorInliningPhase, callInstr->m_func)) ||
            (!isInlined && PHASE_OFF(Js::FixedCtorCallsPhase, callInstr->m_func)) ||
            (methodPropertyOpnd->UsesAccessor()))) ||
        (!isCtor &&
            ((isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedBuiltInMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && PHASE_OFF(Js::FixedBuiltInMethodCallsPhase, callInstr->m_func)))) ||
            (!isBuiltIn &&
                ((isInlined && PHASE_OFF(Js::FixedScriptMethodInliningPhase, callInstr->m_func)) ||
                (!isInlined && !PHASE_ON(Js::FixedScriptMethodCallsPhase, callInstr->m_func))))))
       )
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (#%u): %s non-fixed method %s (%s #%u) (cache id: %d), because %s fixed %s %s is disabled.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex, isInlined ? _u("inlining") : _u("calling"), isBuiltIn ? _u("built-in") : _u("script"),
                isCtor ? _u("ctors") : _u("methods"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (!methodPropertyOpnd->IsObjTypeSpecCandidate() && !methodPropertyOpnd->IsRootObjectNonConfigurableFieldLoad())
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d), because inline cache has no cached type.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex);
            Output::Flush();
        }
#endif
        return false;
    }

    FixedFieldInfo * fixedField = nullptr;
    if (!isPolymorphic)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction() : nullptr;
    }
    else if (isPolymorphic && isInlined)
    {
        fixedField = methodPropertyOpnd->HasFixedValue() ? methodPropertyOpnd->GetFixedFunction(i) : nullptr;
    }

    if (!fixedField)
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because inline cache has no fixed function object.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    // Certain built-ins that we decide not to inline will get a fast path emitted by the lowerer.
    // The lowering code cannot handle a call with a fixed function target, because it needs access to
    // the original property sym. Turn off fixed method calls for these cases.
    if (inlineeInfo == nullptr && Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))
    {
#if TRACE_FIXED_FIELDS
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            const char16* calleeName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");

            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);

            Output::Print(_u("FixedFields: function %s (%s): %s non-fixed method %s (%s %s) (cache id: %d, layout: %s), because callee is a built-in with fast path in lowerer.\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"), methodPropertyRecord->GetBuffer(), calleeName,
                calleeFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer2) : _u("(null)"),
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
        return false;
    }

    if (inlineeInfo != nullptr && fixedField->GetFuncInfoAddr() != inlineeInfo->GetFunctionInfoAddr())
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            bool isProto = methodPropertyOpnd->IsLoadedFromProto();
            bool isAccessor = methodPropertyOpnd->UsesAccessor();
            Js::FunctionBody* fixedFunctionBody   = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers   = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");
            JITTimeFunctionBody* profileFunctionBody = inlineeInfo->GetBody();
            const char16* profileFunctionName    = profileFunctionBody != nullptr ? profileFunctionBody->GetDisplayName() : _u("<unknown>");
            const char16* profileFunctionNumbers = profileFunctionBody ? inlineeInfo->GetDebugNumberSet(debugStringBuffer3) : _u("(null)");

            if (PHASE_TRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                intptr_t protoObject = isProto ? methodPropertyOpnd->GetProtoObject() : 0;
                Output::Print(_u("FixedFields: function %s (#%s): function body mismatch for inlinee: %s (%s) 0x%p->0x%p != %s (%s) 0x%p (cache id: %d, layout: %s, type: 0x%p, proto: 0x%p, proto type: 0x%p).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, functionObject, functionObject->GetFunctionInfo(),
                    profileFunctionName, profileFunctionNumbers, inlineeInfo->GetFunctionInfoAddr(),
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"),
                    methodPropertyOpnd->GetType(), protoObject, protoObject != nullptr ? protoObject->GetType() : nullptr);
            }
            if (PHASE_TESTTRACE(Js::FixedMethodsPhase, callInstr->m_func))
            {
                Output::Print(_u("FixedFields: function %s (%s): function body mismatch for inlinee: %s (%s) != %s (%s) (cache id: %d, layout: %s).\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                    methodPropertyRecord->GetBuffer(), fixedFunctionNumbers, profileFunctionName, profileFunctionNumbers,
                    methodPropertyOpnd->m_inlineCacheIndex, isProto ? _u("proto") : isAccessor ? _u("accessor") : _u("local"));
            }
            Output::Flush();
        }
#endif
        // It appears that under certain bailout and re-JIT conditions we may end up with an updated
        // inline cache pointing to a new function object, while the call site profile info still
        // holds the old function body.  If the two don't match, let's fall back on the regular LdMethodFld.
        return false;
    }
    else
    {
#if TRACE_FIXED_FIELDS && 0// TODO: OOP JIT, trace fixed fields
        if (printFixedFieldsTrace)
        {
            JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
            Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
            Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetInProcThreadContext()->GetPropertyRecord(methodPropertyId);
            const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
            Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
            const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

            Output::Print(_u("FixedFields: function %s (%s): %s fixed method %s (%s %s) (cache id: %d, layout: %s).\n"),
                callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer),
                inlineeInfo != nullptr ? _u("inlining") : _u("calling"),
                methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                methodPropertyOpnd->m_inlineCacheIndex,
                methodPropertyOpnd->IsLoadedFromProto() ? _u("proto") : methodPropertyOpnd->UsesAccessor() ? _u("accessor") : _u("local"));
            Output::Flush();
        }
#endif
    }

#undef TRACE_FIXED_FIELDS

    if (dontOptimizeJustCheck)
    {
        return true;
    }

    // Change Ld[Root]MethodFld, LdMethodFromFlags to CheckFixedFld, which doesn't need a dst.
    if(ldMethodFldInstr->m_opcode == Js::OpCode::LdMethodFromFlags)
    {
        Assert(ldMethodFldInstr->HasBailOutInfo());
        ldMethodFldInstr->ClearBailOutInfo();
    }
    ldMethodFldInstr->m_opcode = Js::OpCode::CheckFixedFld;
    IR::Opnd * methodValueDstOpnd = ldMethodFldInstr->UnlinkDst();
    IR::Instr * chkMethodFldInstr = ldMethodFldInstr->ConvertToBailOutInstr(ldMethodFldInstr,
        !methodPropertyOpnd->HasEquivalentTypeSet() ? IR::BailOutFailedFixedFieldTypeCheck : IR::BailOutFailedEquivalentFixedFieldTypeCheck);
    chkMethodFldInstr->GetBailOutInfo()->polymorphicCacheIndex = methodPropertyOpnd->m_inlineCacheIndex;

    Assert(chkMethodFldInstr->GetSrc1()->IsSymOpnd());
    if (chkMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        Assert(chkMethodFldInstr->m_opcode == Js::OpCode::CheckFixedFld);
        IR::PropertySymOpnd* chkMethodFldOpnd = chkMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
        // For polymorphic field loads we only support fixed functions on prototypes. This helps keep the equivalence check helper simple.
        Assert(chkMethodFldOpnd->IsMono() || chkMethodFldOpnd->IsLoadedFromProto() || chkMethodFldOpnd->UsesAccessor());
        chkMethodFldOpnd->SetUsesFixedValue(true);
    }

    if (isCtor)
    {
        JITTimeConstructorCache* constructorCache = methodPropertyOpnd->GetCtorCache();
        if (constructorCache != nullptr && callInstr->IsProfiledInstr())
        {

#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): fixed new object for %s with %s ctor %s (%s %s)%s\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache->SkipNewScObject() ? _u(" skip default object") : _u(""));
                Output::Flush();
            }
#endif

            // The profile ID's hung from array ctor opcodes don't match up with normal profiled call sites.
            if (callInstr->m_opcode != Js::OpCode::NewScObjArray)
            {
                // Because we are storing flow sensitive info in the cache (guarded property operations),
                // we must make sure the same cache cannot be used multiple times in the flow.
                if (constructorCache->IsUsed())
                {
                    // It's okay to allocate a JitTimeConstructorCache from the func's allocator (rather than recycler),
                    // because we only use these during JIT. We use the underlying runtime cache as a guard that must
                    // live after JIT, and these are added to the EntryPointInfo during work item creation and thus kept alive.
                    constructorCache = constructorCache->Clone(this->topFunc->m_alloc);
                }
                Assert(!constructorCache->IsUsed());
                constructorCache->SetUsed(true);
                callInstr->m_func->SetConstructorCache(static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId), constructorCache);
            }
        }
        else
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS && 0// TODO: OOP JIT, trace fixed fields
            if (PHASE_TRACE(Js::FixedNewObjPhase, callInstr->m_func) || PHASE_TESTTRACE(Js::FixedNewObjPhase, callInstr->m_func))
            {
                JITTimeFunctionBody* calleeFunctionBody = inlineeInfo != nullptr && inlineeInfo->HasBody() ? inlineeInfo->GetBody() : nullptr;
                Js::PropertyId methodPropertyId = callInstr->m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(methodPropertyOpnd->m_inlineCacheIndex);
                Js::PropertyRecord const * const methodPropertyRecord = callInstr->m_func->GetThreadContextInfo()->GetPropertyRecord(methodPropertyId);
                const char16* fixedFunctionName = calleeFunctionBody != nullptr ? calleeFunctionBody->GetDisplayName() : _u("<unknown>");
                Js::FunctionBody* fixedFunctionBody = functionObject->GetFunctionInfo()->GetFunctionBody();
                const char16* fixedFunctionNumbers = fixedFunctionBody ? fixedFunctionBody->GetDebugNumberSet(debugStringBuffer2) : _u("(null)");

                Output::Print(_u("FixedNewObj: function %s (%s): non-fixed new object for %s with %s ctor %s (%s %s), because %s.\n"),
                    callInstr->m_func->GetJITFunctionBody()->GetDisplayName(), callInstr->m_func->GetDebugNumberSet(debugStringBuffer), Js::OpCodeUtil::GetOpCodeName(callInstr->m_opcode),
                    inlineeInfo != nullptr ? _u("inlined") : _u("called"),
                    methodPropertyRecord->GetBuffer(), fixedFunctionName, fixedFunctionNumbers,
                    constructorCache == nullptr ? _u("constructor cache hasn't been cloned") : _u("instruction isn't profiled"));
                Output::Flush();
            }
#endif
        }
    }

    // Insert a load instruction to place the constant address in methodOpnd (the Ld[Root]MethodFld's original dst).
    IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(fixedField->GetFieldValue(), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
    constMethodValueOpnd->m_metadata = fixedField;
    constMethodValueOpnd->m_isFunction = true;
    IR::Instr * ldMethodValueInstr = IR::Instr::New(Js::OpCode::Ld_A, methodValueDstOpnd, constMethodValueOpnd, callInstr->m_func);
    StackSym* methodSym = methodValueDstOpnd->AsRegOpnd()->m_sym;
    if (methodSym->IsSingleDef())
    {
        methodSym->SetIsConst();
    }
    methodValueDstOpnd->SetValueType(fixedField->GetValueType());
    chkMethodFldInstr->InsertAfter(ldMethodValueInstr);
    callInstr->ReplaceSrc1(constMethodValueOpnd);
    if (callInstr->m_opcode == Js::OpCode::CallI || callInstr->CallsAccessor(methodPropertyOpnd))
    {
        callInstr->m_opcode = Js::OpCode::CallIFixed;
    }
    else
    {
        // We patch later for constructor inlining.
        AssertOrFailFast(
            callInstr->m_opcode == Js::OpCode::NewScObject ||
            callInstr->m_opcode == Js::OpCode::NewScObjArray);
    }

    if (!isBuiltIn && isInlined)
    {
        // We eliminate CheckThis for fixed method inlining. Assert here that our assumption is true.
        Js::TypeId typeId = methodPropertyOpnd->IsRootObjectNonConfigurableField() ?
            Js::TypeIds_GlobalObject : methodPropertyOpnd->GetTypeId();
        if(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType)
        {
            // Eliminate CheckThis for inlining.
            safeThis = true;
        }
    }
    return true;
}